

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint val)

{
  uint *__s;
  bool bVar1;
  uint *puVar2;
  ulong uVar3;
  
  bVar1 = is_empty(this);
  if (!bVar1) {
    uVar3 = (ulong)(this->_height * this->_width * this->_depth * this->_spectrum);
    __s = this->_data;
    if (val == 0) {
      memset(__s,0,uVar3 << 2);
    }
    else {
      for (puVar2 = __s + uVar3; __s < puVar2; puVar2 = puVar2 + -1) {
        puVar2[-1] = val;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,size()*sizeof(T));
      return *this;
    }